

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int wherePathSolver(WhereInfo *pWInfo,LogEst nRowEst)

{
  undefined8 *puVar1;
  char cVar2;
  ushort uVar3;
  ushort uVar4;
  undefined2 uVar5;
  Parse *pPVar6;
  WhereLoop *pWVar7;
  ulong uVar8;
  ulong uVar9;
  WherePath *pWVar10;
  short sVar11;
  WhereInfo *pWInfo_00;
  byte bVar12;
  i8 iVar13;
  LogEst LVar14;
  short sVar15;
  short sVar16;
  LogEst LVar17;
  int extraout_EAX;
  WhereLoop ***pppWVar18;
  undefined6 extraout_var;
  LogEst *pLVar19;
  WhereLoop **ppWVar20;
  uint uVar21;
  undefined4 uVar22;
  long lVar23;
  short sVar24;
  long lVar25;
  int iVar26;
  uint uVar27;
  undefined6 in_register_00000032;
  WherePath *pWVar28;
  ExprList *pOrderBy;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  uint uVar32;
  uint uVar33;
  WherePath *pPath;
  WherePath *pWVar34;
  Bitmask revMask;
  int local_dc;
  ulong local_d8;
  ulong local_d0;
  uint local_c4;
  WhereLoop **local_c0;
  ulong local_b8;
  WherePath *local_b0;
  undefined8 local_a8;
  WhereInfo *local_a0;
  int local_94;
  undefined4 local_90;
  uint local_8c;
  uint local_88;
  uint local_84;
  Parse *local_80;
  ulong local_78;
  WherePath *local_70;
  ulong local_68;
  LogEst *local_60;
  ulong local_58;
  WhereLoop **local_50;
  WherePath *local_48;
  size_t local_40;
  long local_38;
  
  local_a8 = CONCAT62(in_register_00000032,nRowEst);
  pPVar6 = pWInfo->pParse;
  bVar12 = pWInfo->nLevel;
  uVar33 = (uint)bVar12;
  lVar23 = (ulong)(uVar33 != 2) * 5 + 5;
  if (uVar33 < 2) {
    lVar23 = 1;
  }
  local_dc = 0;
  if (nRowEst != 0 && pWInfo->pOrderBy != (ExprList *)0x0) {
    local_dc = pWInfo->pOrderBy->nExpr;
  }
  iVar26 = (int)lVar23 * 2;
  lVar25 = (long)local_dc;
  local_a0 = pWInfo;
  local_b0 = (WherePath *)
             sqlite3DbMallocRawNN
                       (pPVar6->db,
                        (long)(int)(((uint)bVar12 * 8 + 0x20) * iVar26 + (int)(lVar25 * 2)));
  if (local_b0 == (WherePath *)0x0) {
    return 0;
  }
  uVar29 = (ulong)(uint)((int)lVar23 << 5);
  pPath = (WherePath *)((long)&local_b0->maskLoop + uVar29);
  puVar1 = (undefined8 *)((long)&local_b0->nRow + uVar29);
  *puVar1 = 0;
  puVar1[1] = 0;
  puVar1 = (undefined8 *)((long)&local_b0->maskLoop + uVar29);
  *puVar1 = 0;
  puVar1[1] = 0;
  local_c0 = (WhereLoop **)((long)&pPath->maskLoop + uVar29);
  pppWVar18 = &local_b0->aLoop;
  for (; 0 < iVar26; iVar26 = iVar26 + -1) {
    *pppWVar18 = local_c0;
    pppWVar18 = pppWVar18 + 4;
    local_c0 = (WhereLoop **)((long)local_c0 + (ulong)((uint)bVar12 * 8));
  }
  local_80 = pPVar6;
  local_38 = lVar23;
  if (local_dc == 0) {
    local_c0 = (WhereLoop **)0x0;
  }
  else {
    memset(local_c0,0,lVar25 * 2);
  }
  uVar5 = local_80->nQueryLoop;
  sVar24 = 0x30;
  if ((short)uVar5 < 0x30) {
    sVar24 = uVar5;
  }
  pPath->nRow = sVar24;
  if (local_dc != 0) {
    pPath->isOrdered = -((ulong)bVar12 != 0) | (byte)local_dc;
  }
  local_50 = &local_a0->pLoops;
  local_94 = (int)local_a8 + -10;
  local_78 = (ulong)uVar33;
  uVar29 = 0;
  uVar33 = 1;
  uVar30 = 0;
  uVar31 = 0;
  uVar32 = 0;
  local_70 = local_b0;
  local_68 = (ulong)bVar12;
  do {
    uVar8 = local_68;
    pWVar34 = local_70;
    pPVar6 = local_80;
    pWInfo_00 = local_a0;
    if (uVar29 == local_78) {
      if (uVar33 == 0) {
        sqlite3ErrorMsg(local_80,"no query solution");
      }
      else {
        pWVar10 = pPath;
        for (lVar23 = 1; lVar23 < (int)uVar33; lVar23 = lVar23 + 1) {
          pWVar28 = pWVar10 + 1;
          if (pPath->rCost <= pWVar10[1].rCost) {
            pWVar28 = pPath;
          }
          pPath = pWVar28;
          pWVar10 = pWVar10 + 1;
        }
        ppWVar20 = &local_a0->a[0].pWLoop;
        for (uVar29 = 0; local_78 != uVar29; uVar29 = uVar29 + 1) {
          pWVar7 = pPath->aLoop[uVar29];
          *ppWVar20 = pWVar7;
          bVar12 = pWVar7->iTab;
          *(byte *)(ppWVar20 + -4) = bVar12;
          *(int *)((long)ppWVar20 + -0x5c) = local_a0->pTabList->a[bVar12].iCursor;
          ppWVar20 = ppWVar20 + 0xe;
        }
        if (((((local_a0->wctrlFlags & 0x180) == 0x100) && ((short)local_a8 != 0)) &&
            (local_a0->eDistinct == '\0')) &&
           (iVar13 = wherePathSatisfiesOrderBy
                               (local_a0,local_a0->pResultSet,pPath,0x80,(short)local_68 - 1,
                                pPath->aLoop[local_68 - 1],&revMask),
           pWInfo_00->pResultSet->nExpr == (int)iVar13)) {
          pWInfo_00->eDistinct = '\x02';
        }
        bVar12 = pWInfo_00->field_0x44;
        pWInfo_00->field_0x44 = bVar12 & 0xfb;
        pOrderBy = pWInfo_00->pOrderBy;
        if (pOrderBy != (ExprList *)0x0) {
          cVar2 = pPath->isOrdered;
          pWInfo_00->nOBSat = cVar2;
          uVar3 = pWInfo_00->wctrlFlags;
          uVar33 = (uint)uVar3;
          iVar26 = (int)uVar8;
          if ((char)uVar3 < '\0') {
            if (pOrderBy->nExpr == (int)cVar2) {
              pWInfo_00->eDistinct = '\x02';
            }
          }
          else {
            pWInfo_00->revMask = pPath->revLoop;
            if (cVar2 < '\x01') {
              pWInfo_00->nOBSat = '\0';
              if (uVar8 != 0) {
                uVar32 = pPath->aLoop[iVar26 - 1U]->wsFlags;
                if ((~uVar32 & 0x104) != 0 && (uVar32 >> 0xc & 1) == 0) {
                  revMask = 0;
                  iVar13 = wherePathSatisfiesOrderBy
                                     (pWInfo_00,pOrderBy,pPath,0x800,(u16)(iVar26 - 1U),
                                      pPath->aLoop[iVar26 - 1U],&revMask);
                  pOrderBy = pWInfo_00->pOrderBy;
                  if (pOrderBy->nExpr == (int)iVar13) {
                    pWInfo_00->field_0x44 = pWInfo_00->field_0x44 | 4;
                    pWInfo_00->revMask = revMask;
                  }
                  uVar33 = (uint)pWInfo_00->wctrlFlags;
                }
              }
            }
            else if (((uVar3 & 3) != 0 && iVar26 != 0) && cVar2 == '\x01') {
              pWInfo_00->field_0x44 = bVar12 | 4;
            }
          }
          if ((((uVar33 >> 9 & 1) != 0) && (uVar8 != 0)) &&
             (pOrderBy->nExpr == (int)pWInfo_00->nOBSat)) {
            revMask = 0;
            iVar13 = wherePathSatisfiesOrderBy
                               (pWInfo_00,pOrderBy,pPath,0,(u16)(iVar26 - 1U),
                                pPath->aLoop[iVar26 - 1U],&revMask);
            if (pWInfo_00->pOrderBy->nExpr == (int)iVar13) {
              pWInfo_00->field_0x44 = pWInfo_00->field_0x44 | 8;
              pWInfo_00->revMask = revMask;
            }
          }
        }
        pWInfo_00->nRowOut = pPath->nRow;
      }
      sqlite3DbFreeNN(pPVar6->db,pWVar34);
      return extraout_EAX;
    }
    local_40 = uVar29 * 8;
    local_88 = uVar33;
    if ((int)uVar33 < 1) {
      local_88 = 0;
    }
    local_60 = &local_b0[1].rUnsorted;
    local_8c = (uint)uVar29 & 0xffff;
    uVar21 = 0;
    local_b8 = uVar29;
    local_48 = pPath;
    uVar33 = 0;
    while (ppWVar20 = local_50, uVar21 != local_88) {
      while (local_84 = uVar21, pWVar7 = *ppWVar20, pWVar7 != (WhereLoop *)0x0) {
        uVar8 = pPath->maskLoop;
        if ((((pWVar7->prereq & ~uVar8) == 0) && (uVar9 = pWVar7->maskSelf, (uVar9 & uVar8) == 0))
           && ((sVar24 = pPath->nRow, (pWVar7->wsFlags & 0x4000) == 0 || (2 < sVar24)))) {
          local_d8 = uVar30;
          local_d0 = uVar31;
          local_c4 = uVar33;
          LVar14 = sqlite3LogEstAdd(pWVar7->rSetup,pWVar7->rRun + sVar24);
          sVar15 = sqlite3LogEstAdd(LVar14,pPath->rUnsorted);
          sVar24 = sVar24 + pWVar7->nOut;
          bVar12 = pPath->isOrdered;
          if ((char)bVar12 < '\0') {
            revMask = 0;
            bVar12 = wherePathSatisfiesOrderBy
                               (local_a0,local_a0->pOrderBy,pPath,local_a0->wctrlFlags,(u16)local_8c
                                ,pWVar7,&revMask);
          }
          else {
            revMask = pPath->revLoop;
          }
          iVar26 = local_dc - (char)bVar12;
          uVar22 = (undefined4)CONCAT62(extraout_var,sVar15);
          if ((iVar26 == 0 || local_dc < (char)bVar12) || (char)bVar12 < '\0') {
            LVar14 = sVar15 + -2;
          }
          else {
            sVar15 = *(short *)((long)local_c0 + (ulong)bVar12 * 2);
            if (sVar15 == 0) {
              local_90 = uVar22;
              local_58 = (ulong)bVar12;
              LVar14 = sqlite3LogEst((long)((local_a0->pSelect->pEList->nExpr + 0x3b) / 0x1e));
              sVar15 = LVar14 + (short)local_a8;
              if (bVar12 != 0) {
                LVar14 = sqlite3LogEst((long)((iVar26 * 100) / local_dc));
                sVar15 = LVar14 + sVar15 + -0x42;
              }
              sVar11 = (short)local_a8;
              if ((local_a0->wctrlFlags >> 0xe & 1) == 0) {
                sVar16 = sVar11;
                if ((local_a0->wctrlFlags & 0x100) != 0) {
                  sVar16 = (short)local_94;
                }
                if (sVar11 < 0xb) {
                  sVar16 = sVar11;
                }
              }
              else {
                sVar16 = 10;
                if (bVar12 != 0) {
                  sVar16 = 0x10;
                }
                sVar15 = sVar15 + sVar16;
                sVar16 = local_a0->iLimit;
                if (sVar11 <= local_a0->iLimit) {
                  sVar16 = sVar11;
                }
              }
              LVar14 = estLog(sVar16);
              sVar15 = sVar15 + LVar14;
              *(short *)((long)local_c0 + local_58 * 2) = sVar15;
              uVar22 = local_90;
            }
            LVar14 = (LogEst)uVar22;
            LVar17 = sqlite3LogEstAdd(LVar14,sVar15);
            sVar15 = LVar17 + 3;
          }
          pWVar34 = local_b0;
          uVar21 = 0;
          if (0 < (int)local_c4) {
            uVar21 = local_c4;
          }
          while( true ) {
            uVar27 = (uint)local_38;
            uVar29 = local_b8;
            uVar30 = local_d8;
            uVar31 = local_d0;
            uVar33 = local_c4;
            if (uVar21 == 0) break;
            if ((pWVar34->maskLoop == (uVar9 | uVar8)) && (-1 < (char)(pWVar34->isOrdered ^ bVar12))
               ) {
              if ((pWVar34->rCost < sVar15) ||
                 ((pWVar34->rCost == sVar15 &&
                  ((pWVar34->nRow < sVar24 ||
                   ((pWVar34->nRow == sVar24 && (pWVar34->rUnsorted <= LVar14))))))))
              goto LAB_00179373;
              goto LAB_0017928e;
            }
            pWVar34 = pWVar34 + 1;
            uVar21 = uVar21 - 1;
          }
          uVar21 = local_c4;
          if ((int)uVar27 <= (int)local_c4) {
            if (((short)local_d0 < sVar15) ||
               ((uVar21 = uVar32, sVar15 == (short)local_d0 && ((short)local_d8 <= LVar14))))
            goto LAB_00179373;
          }
          uVar33 = local_c4 + ((int)local_c4 < (int)uVar27);
          pWVar34 = local_b0 + (int)uVar21;
LAB_0017928e:
          pWVar34->maskLoop = pWVar7->maskSelf | pPath->maskLoop;
          pWVar34->revLoop = revMask;
          pWVar34->nRow = sVar24;
          pWVar34->rCost = sVar15;
          pWVar34->rUnsorted = LVar14;
          pWVar34->isOrdered = bVar12;
          memcpy(pWVar34->aLoop,pPath->aLoop,local_40);
          pWVar34->aLoop[local_b8] = pWVar7;
          uVar29 = local_b8;
          uVar30 = local_d8;
          uVar31 = local_d0;
          if ((int)uVar27 <= (int)uVar33) {
            uVar30 = (ulong)(ushort)local_b0->nRow;
            uVar31 = (ulong)(ushort)local_b0->rCost;
            uVar32 = 0;
            pLVar19 = local_60;
            for (uVar21 = 1; uVar21 < uVar27; uVar21 = uVar21 + 1) {
              uVar3 = pLVar19[-1];
              if ((short)(ushort)uVar31 < (short)uVar3) {
                uVar4 = *pLVar19;
LAB_00179317:
                uVar30 = (ulong)uVar4;
                uVar31 = (ulong)uVar3;
                uVar32 = uVar21;
              }
              else if ((uVar3 == (ushort)uVar31) && (uVar4 = *pLVar19, (short)uVar30 < (short)uVar4)
                      ) goto LAB_00179317;
              pLVar19 = pLVar19 + 0x10;
            }
          }
        }
LAB_00179373:
        uVar21 = local_84;
        ppWVar20 = &pWVar7->pNextLoop;
      }
      pPath = pPath + 1;
      uVar21 = local_84 + 1;
    }
    uVar29 = uVar29 + 1;
    pPath = local_b0;
    local_b0 = local_48;
  } while( true );
}

Assistant:

static int wherePathSolver(WhereInfo *pWInfo, LogEst nRowEst){
  int mxChoice;             /* Maximum number of simultaneous paths tracked */
  int nLoop;                /* Number of terms in the join */
  Parse *pParse;            /* Parsing context */
  int iLoop;                /* Loop counter over the terms of the join */
  int ii, jj;               /* Loop counters */
  int mxI = 0;              /* Index of next entry to replace */
  int nOrderBy;             /* Number of ORDER BY clause terms */
  LogEst mxCost = 0;        /* Maximum cost of a set of paths */
  LogEst mxUnsorted = 0;    /* Maximum unsorted cost of a set of path */
  int nTo, nFrom;           /* Number of valid entries in aTo[] and aFrom[] */
  WherePath *aFrom;         /* All nFrom paths at the previous level */
  WherePath *aTo;           /* The nTo best paths at the current level */
  WherePath *pFrom;         /* An element of aFrom[] that we are working on */
  WherePath *pTo;           /* An element of aTo[] that we are working on */
  WhereLoop *pWLoop;        /* One of the WhereLoop objects */
  WhereLoop **pX;           /* Used to divy up the pSpace memory */
  LogEst *aSortCost = 0;    /* Sorting and partial sorting costs */
  char *pSpace;             /* Temporary memory used by this routine */
  int nSpace;               /* Bytes of space allocated at pSpace */

  pParse = pWInfo->pParse;
  nLoop = pWInfo->nLevel;
  /* TUNING: For simple queries, only the best path is tracked.
  ** For 2-way joins, the 5 best paths are followed.
  ** For joins of 3 or more tables, track the 10 best paths */
  mxChoice = (nLoop<=1) ? 1 : (nLoop==2 ? 5 : 10);
  assert( nLoop<=pWInfo->pTabList->nSrc );
  WHERETRACE(0x002, ("---- begin solver.  (nRowEst=%d, nQueryLoop=%d)\n",
                     nRowEst, pParse->nQueryLoop));

  /* If nRowEst is zero and there is an ORDER BY clause, ignore it. In this
  ** case the purpose of this call is to estimate the number of rows returned
  ** by the overall query. Once this estimate has been obtained, the caller
  ** will invoke this function a second time, passing the estimate as the
  ** nRowEst parameter.  */
  if( pWInfo->pOrderBy==0 || nRowEst==0 ){
    nOrderBy = 0;
  }else{
    nOrderBy = pWInfo->pOrderBy->nExpr;
  }

  /* Allocate and initialize space for aTo, aFrom and aSortCost[] */
  nSpace = (sizeof(WherePath)+sizeof(WhereLoop*)*nLoop)*mxChoice*2;
  nSpace += sizeof(LogEst) * nOrderBy;
  pSpace = sqlite3StackAllocRawNN(pParse->db, nSpace);
  if( pSpace==0 ) return SQLITE_NOMEM_BKPT;
  aTo = (WherePath*)pSpace;
  aFrom = aTo+mxChoice;
  memset(aFrom, 0, sizeof(aFrom[0]));
  pX = (WhereLoop**)(aFrom+mxChoice);
  for(ii=mxChoice*2, pFrom=aTo; ii>0; ii--, pFrom++, pX += nLoop){
    pFrom->aLoop = pX;
  }
  if( nOrderBy ){
    /* If there is an ORDER BY clause and it is not being ignored, set up
    ** space for the aSortCost[] array. Each element of the aSortCost array
    ** is either zero - meaning it has not yet been initialized - or the
    ** cost of sorting nRowEst rows of data where the first X terms of
    ** the ORDER BY clause are already in order, where X is the array
    ** index.  */
    aSortCost = (LogEst*)pX;
    memset(aSortCost, 0, sizeof(LogEst) * nOrderBy);
  }
  assert( aSortCost==0 || &pSpace[nSpace]==(char*)&aSortCost[nOrderBy] );
  assert( aSortCost!=0 || &pSpace[nSpace]==(char*)pX );

  /* Seed the search with a single WherePath containing zero WhereLoops.
  **
  ** TUNING: Do not let the number of iterations go above 28.  If the cost
  ** of computing an automatic index is not paid back within the first 28
  ** rows, then do not use the automatic index. */
  aFrom[0].nRow = MIN(pParse->nQueryLoop, 48);  assert( 48==sqlite3LogEst(28) );
  nFrom = 1;
  assert( aFrom[0].isOrdered==0 );
  if( nOrderBy ){
    /* If nLoop is zero, then there are no FROM terms in the query. Since
    ** in this case the query may return a maximum of one row, the results
    ** are already in the requested order. Set isOrdered to nOrderBy to
    ** indicate this. Or, if nLoop is greater than zero, set isOrdered to
    ** -1, indicating that the result set may or may not be ordered,
    ** depending on the loops added to the current plan.  */
    aFrom[0].isOrdered = nLoop>0 ? -1 : nOrderBy;
  }

  /* Compute successively longer WherePaths using the previous generation
  ** of WherePaths as the basis for the next.  Keep track of the mxChoice
  ** best paths at each generation */
  for(iLoop=0; iLoop<nLoop; iLoop++){
    nTo = 0;
    for(ii=0, pFrom=aFrom; ii<nFrom; ii++, pFrom++){
      for(pWLoop=pWInfo->pLoops; pWLoop; pWLoop=pWLoop->pNextLoop){
        LogEst nOut;                      /* Rows visited by (pFrom+pWLoop) */
        LogEst rCost;                     /* Cost of path (pFrom+pWLoop) */
        LogEst rUnsorted;                 /* Unsorted cost of (pFrom+pWLoop) */
        i8 isOrdered;                     /* isOrdered for (pFrom+pWLoop) */
        Bitmask maskNew;                  /* Mask of src visited by (..) */
        Bitmask revMask;                  /* Mask of rev-order loops for (..) */

        if( (pWLoop->prereq & ~pFrom->maskLoop)!=0 ) continue;
        if( (pWLoop->maskSelf & pFrom->maskLoop)!=0 ) continue;
        if( (pWLoop->wsFlags & WHERE_AUTO_INDEX)!=0 && pFrom->nRow<3 ){
          /* Do not use an automatic index if the this loop is expected
          ** to run less than 1.25 times.  It is tempting to also exclude
          ** automatic index usage on an outer loop, but sometimes an automatic
          ** index is useful in the outer loop of a correlated subquery. */
          assert( 10==sqlite3LogEst(2) );
          continue;
        }

        /* At this point, pWLoop is a candidate to be the next loop.
        ** Compute its cost */
        rUnsorted = sqlite3LogEstAdd(pWLoop->rSetup,pWLoop->rRun + pFrom->nRow);
        rUnsorted = sqlite3LogEstAdd(rUnsorted, pFrom->rUnsorted);
        nOut = pFrom->nRow + pWLoop->nOut;
        maskNew = pFrom->maskLoop | pWLoop->maskSelf;
        isOrdered = pFrom->isOrdered;
        if( isOrdered<0 ){
          revMask = 0;
          isOrdered = wherePathSatisfiesOrderBy(pWInfo,
                       pWInfo->pOrderBy, pFrom, pWInfo->wctrlFlags,
                       iLoop, pWLoop, &revMask);
        }else{
          revMask = pFrom->revLoop;
        }
        if( isOrdered>=0 && isOrdered<nOrderBy ){
          if( aSortCost[isOrdered]==0 ){
            aSortCost[isOrdered] = whereSortingCost(
                pWInfo, nRowEst, nOrderBy, isOrdered
            );
          }
          /* TUNING:  Add a small extra penalty (3) to sorting as an
          ** extra encouragement to the query planner to select a plan
          ** where the rows emerge in the correct order without any sorting
          ** required. */
          rCost = sqlite3LogEstAdd(rUnsorted, aSortCost[isOrdered]) + 3;

          WHERETRACE(0x002,
              ("---- sort cost=%-3d (%d/%d) increases cost %3d to %-3d\n",
               aSortCost[isOrdered], (nOrderBy-isOrdered), nOrderBy,
               rUnsorted, rCost));
        }else{
          rCost = rUnsorted;
          rUnsorted -= 2;  /* TUNING:  Slight bias in favor of no-sort plans */
        }

        /* Check to see if pWLoop should be added to the set of
        ** mxChoice best-so-far paths.
        **
        ** First look for an existing path among best-so-far paths
        ** that covers the same set of loops and has the same isOrdered
        ** setting as the current path candidate.
        **
        ** The term "((pTo->isOrdered^isOrdered)&0x80)==0" is equivalent
        ** to (pTo->isOrdered==(-1))==(isOrdered==(-1))" for the range
        ** of legal values for isOrdered, -1..64.
        */
        for(jj=0, pTo=aTo; jj<nTo; jj++, pTo++){
          if( pTo->maskLoop==maskNew
           && ((pTo->isOrdered^isOrdered)&0x80)==0
          ){
            testcase( jj==nTo-1 );
            break;
          }
        }
        if( jj>=nTo ){
          /* None of the existing best-so-far paths match the candidate. */
          if( nTo>=mxChoice
           && (rCost>mxCost || (rCost==mxCost && rUnsorted>=mxUnsorted))
          ){
            /* The current candidate is no better than any of the mxChoice
            ** paths currently in the best-so-far buffer.  So discard
            ** this candidate as not viable. */
#ifdef WHERETRACE_ENABLED /* 0x4 */
            if( sqlite3WhereTrace&0x4 ){
              sqlite3DebugPrintf("Skip   %s cost=%-3d,%3d,%3d order=%c\n",
                  wherePathName(pFrom, iLoop, pWLoop), rCost, nOut, rUnsorted,
                  isOrdered>=0 ? isOrdered+'0' : '?');
            }
#endif
            continue;
          }
          /* If we reach this points it means that the new candidate path
          ** needs to be added to the set of best-so-far paths. */
          if( nTo<mxChoice ){
            /* Increase the size of the aTo set by one */
            jj = nTo++;
          }else{
            /* New path replaces the prior worst to keep count below mxChoice */
            jj = mxI;
          }
          pTo = &aTo[jj];
#ifdef WHERETRACE_ENABLED /* 0x4 */
          if( sqlite3WhereTrace&0x4 ){
            sqlite3DebugPrintf("New    %s cost=%-3d,%3d,%3d order=%c\n",
                wherePathName(pFrom, iLoop, pWLoop), rCost, nOut, rUnsorted,
                isOrdered>=0 ? isOrdered+'0' : '?');
          }
#endif
        }else{
          /* Control reaches here if best-so-far path pTo=aTo[jj] covers the
          ** same set of loops and has the same isOrdered setting as the
          ** candidate path.  Check to see if the candidate should replace
          ** pTo or if the candidate should be skipped.
          **
          ** The conditional is an expanded vector comparison equivalent to:
          **   (pTo->rCost,pTo->nRow,pTo->rUnsorted) <= (rCost,nOut,rUnsorted)
          */
          if( pTo->rCost<rCost
           || (pTo->rCost==rCost
               && (pTo->nRow<nOut
                   || (pTo->nRow==nOut && pTo->rUnsorted<=rUnsorted)
                  )
              )
          ){
#ifdef WHERETRACE_ENABLED /* 0x4 */
            if( sqlite3WhereTrace&0x4 ){
              sqlite3DebugPrintf(
                  "Skip   %s cost=%-3d,%3d,%3d order=%c",
                  wherePathName(pFrom, iLoop, pWLoop), rCost, nOut, rUnsorted,
                  isOrdered>=0 ? isOrdered+'0' : '?');
              sqlite3DebugPrintf("   vs %s cost=%-3d,%3d,%3d order=%c\n",
                  wherePathName(pTo, iLoop+1, 0), pTo->rCost, pTo->nRow,
                  pTo->rUnsorted, pTo->isOrdered>=0 ? pTo->isOrdered+'0' : '?');
            }
#endif
            /* Discard the candidate path from further consideration */
            testcase( pTo->rCost==rCost );
            continue;
          }
          testcase( pTo->rCost==rCost+1 );
          /* Control reaches here if the candidate path is better than the
          ** pTo path.  Replace pTo with the candidate. */
#ifdef WHERETRACE_ENABLED /* 0x4 */
          if( sqlite3WhereTrace&0x4 ){
            sqlite3DebugPrintf(
                "Update %s cost=%-3d,%3d,%3d order=%c",
                wherePathName(pFrom, iLoop, pWLoop), rCost, nOut, rUnsorted,
                isOrdered>=0 ? isOrdered+'0' : '?');
            sqlite3DebugPrintf("  was %s cost=%-3d,%3d,%3d order=%c\n",
                wherePathName(pTo, iLoop+1, 0), pTo->rCost, pTo->nRow,
                pTo->rUnsorted, pTo->isOrdered>=0 ? pTo->isOrdered+'0' : '?');
          }
#endif
        }
        /* pWLoop is a winner.  Add it to the set of best so far */
        pTo->maskLoop = pFrom->maskLoop | pWLoop->maskSelf;
        pTo->revLoop = revMask;
        pTo->nRow = nOut;
        pTo->rCost = rCost;
        pTo->rUnsorted = rUnsorted;
        pTo->isOrdered = isOrdered;
        memcpy(pTo->aLoop, pFrom->aLoop, sizeof(WhereLoop*)*iLoop);
        pTo->aLoop[iLoop] = pWLoop;
        if( nTo>=mxChoice ){
          mxI = 0;
          mxCost = aTo[0].rCost;
          mxUnsorted = aTo[0].nRow;
          for(jj=1, pTo=&aTo[1]; jj<mxChoice; jj++, pTo++){
            if( pTo->rCost>mxCost
             || (pTo->rCost==mxCost && pTo->rUnsorted>mxUnsorted)
            ){
              mxCost = pTo->rCost;
              mxUnsorted = pTo->rUnsorted;
              mxI = jj;
            }
          }
        }
      }
    }

#ifdef WHERETRACE_ENABLED  /* >=2 */
    if( sqlite3WhereTrace & 0x02 ){
      sqlite3DebugPrintf("---- after round %d ----\n", iLoop);
      for(ii=0, pTo=aTo; ii<nTo; ii++, pTo++){
        sqlite3DebugPrintf(" %s cost=%-3d nrow=%-3d order=%c",
           wherePathName(pTo, iLoop+1, 0), pTo->rCost, pTo->nRow,
           pTo->isOrdered>=0 ? (pTo->isOrdered+'0') : '?');
        if( pTo->isOrdered>0 ){
          sqlite3DebugPrintf(" rev=0x%llx\n", pTo->revLoop);
        }else{
          sqlite3DebugPrintf("\n");
        }
      }
    }
#endif

    /* Swap the roles of aFrom and aTo for the next generation */
    pFrom = aTo;
    aTo = aFrom;
    aFrom = pFrom;
    nFrom = nTo;
  }

  if( nFrom==0 ){
    sqlite3ErrorMsg(pParse, "no query solution");
    sqlite3StackFreeNN(pParse->db, pSpace);
    return SQLITE_ERROR;
  }

  /* Find the lowest cost path.  pFrom will be left pointing to that path */
  pFrom = aFrom;
  for(ii=1; ii<nFrom; ii++){
    if( pFrom->rCost>aFrom[ii].rCost ) pFrom = &aFrom[ii];
  }
  assert( pWInfo->nLevel==nLoop );
  /* Load the lowest cost path into pWInfo */
  for(iLoop=0; iLoop<nLoop; iLoop++){
    WhereLevel *pLevel = pWInfo->a + iLoop;
    pLevel->pWLoop = pWLoop = pFrom->aLoop[iLoop];
    pLevel->iFrom = pWLoop->iTab;
    pLevel->iTabCur = pWInfo->pTabList->a[pLevel->iFrom].iCursor;
  }
  if( (pWInfo->wctrlFlags & WHERE_WANT_DISTINCT)!=0
   && (pWInfo->wctrlFlags & WHERE_DISTINCTBY)==0
   && pWInfo->eDistinct==WHERE_DISTINCT_NOOP
   && nRowEst
  ){
    Bitmask notUsed;
    int rc = wherePathSatisfiesOrderBy(pWInfo, pWInfo->pResultSet, pFrom,
                 WHERE_DISTINCTBY, nLoop-1, pFrom->aLoop[nLoop-1], &notUsed);
    if( rc==pWInfo->pResultSet->nExpr ){
      pWInfo->eDistinct = WHERE_DISTINCT_ORDERED;
    }
  }
  pWInfo->bOrderedInnerLoop = 0;
  if( pWInfo->pOrderBy ){
    pWInfo->nOBSat = pFrom->isOrdered;
    if( pWInfo->wctrlFlags & WHERE_DISTINCTBY ){
      if( pFrom->isOrdered==pWInfo->pOrderBy->nExpr ){
        pWInfo->eDistinct = WHERE_DISTINCT_ORDERED;
      }
      /* vvv--- See check-in [12ad822d9b827777] on 2023-03-16 ---vvv */
      assert( pWInfo->pSelect->pOrderBy==0
           || pWInfo->nOBSat <= pWInfo->pSelect->pOrderBy->nExpr );
    }else{
      pWInfo->revMask = pFrom->revLoop;
      if( pWInfo->nOBSat<=0 ){
        pWInfo->nOBSat = 0;
        if( nLoop>0 ){
          u32 wsFlags = pFrom->aLoop[nLoop-1]->wsFlags;
          if( (wsFlags & WHERE_ONEROW)==0
           && (wsFlags&(WHERE_IPK|WHERE_COLUMN_IN))!=(WHERE_IPK|WHERE_COLUMN_IN)
          ){
            Bitmask m = 0;
            int rc = wherePathSatisfiesOrderBy(pWInfo, pWInfo->pOrderBy, pFrom,
                      WHERE_ORDERBY_LIMIT, nLoop-1, pFrom->aLoop[nLoop-1], &m);
            testcase( wsFlags & WHERE_IPK );
            testcase( wsFlags & WHERE_COLUMN_IN );
            if( rc==pWInfo->pOrderBy->nExpr ){
              pWInfo->bOrderedInnerLoop = 1;
              pWInfo->revMask = m;
            }
          }
        }
      }else if( nLoop
            && pWInfo->nOBSat==1
            && (pWInfo->wctrlFlags & (WHERE_ORDERBY_MIN|WHERE_ORDERBY_MAX))!=0
            ){
        pWInfo->bOrderedInnerLoop = 1;
      }
    }
    if( (pWInfo->wctrlFlags & WHERE_SORTBYGROUP)
        && pWInfo->nOBSat==pWInfo->pOrderBy->nExpr && nLoop>0
    ){
      Bitmask revMask = 0;
      int nOrder = wherePathSatisfiesOrderBy(pWInfo, pWInfo->pOrderBy,
          pFrom, 0, nLoop-1, pFrom->aLoop[nLoop-1], &revMask
      );
      assert( pWInfo->sorted==0 );
      if( nOrder==pWInfo->pOrderBy->nExpr ){
        pWInfo->sorted = 1;
        pWInfo->revMask = revMask;
      }
    }
  }

  pWInfo->nRowOut = pFrom->nRow;

  /* Free temporary memory and return success */
  sqlite3StackFreeNN(pParse->db, pSpace);
  return SQLITE_OK;
}